

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

container_t *
convert_to_bitset_or_array_container(run_container_t *rc,int32_t card,uint8_t *resulttype)

{
  uint16_t *puVar1;
  uint8_t uVar2;
  array_container_t *paVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint16_t run_value;
  uint16_t uVar10;
  int rlepos;
  
  if (card < 0x1001) {
    paVar3 = array_container_create_given_capacity(card);
    paVar3->cardinality = 0;
    uVar8 = 0;
    uVar4 = (ulong)(uint)rc->n_runs;
    if (rc->n_runs < 1) {
      uVar4 = uVar8;
    }
    for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      uVar10 = rc->runs[uVar5].value;
      uVar6 = rc->runs[uVar5].length + uVar10;
      puVar1 = paVar3->array;
      lVar9 = (long)(int)uVar8;
      for (; uVar10 < uVar6; uVar10 = uVar10 + 1) {
        puVar1[lVar9] = uVar10;
        lVar9 = lVar9 + 1;
      }
      uVar7 = (int)lVar9 + 1;
      uVar8 = (ulong)uVar7;
      paVar3->cardinality = uVar7;
      puVar1[lVar9] = uVar6;
    }
    uVar2 = '\x02';
  }
  else {
    paVar3 = (array_container_t *)bitset_container_create();
    for (lVar9 = 0; lVar9 < rc->n_runs; lVar9 = lVar9 + 1) {
      bitset_set_lenrange((uint64_t *)paVar3->array,(uint)rc->runs[lVar9].value,
                          (uint)rc->runs[lVar9].length);
    }
    paVar3->cardinality = card;
    uVar2 = '\x01';
  }
  *resulttype = uVar2;
  return paVar3;
}

Assistant:

container_t *convert_to_bitset_or_array_container(run_container_t *rc,
                                                  int32_t card,
                                                  uint8_t *resulttype) {
    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int rlepos = 0; rlepos < rc->n_runs; ++rlepos) {
            uint16_t run_start = rc->runs[rlepos].value;
            uint16_t run_end = run_start + rc->runs[rlepos].length;
            for (uint16_t run_value = run_start; run_value < run_end;
                 ++run_value) {
                answer->array[answer->cardinality++] = run_value;
            }
            answer->array[answer->cardinality++] = run_end;
        }
        assert(card == answer->cardinality);
        *resulttype = ARRAY_CONTAINER_TYPE;
        // run_container_free(r);
        return answer;
    }
    bitset_container_t *answer = bitset_container_create();
    for (int rlepos = 0; rlepos < rc->n_runs; ++rlepos) {
        uint16_t run_start = rc->runs[rlepos].value;
        bitset_set_lenrange(answer->words, run_start, rc->runs[rlepos].length);
    }
    answer->cardinality = card;
    *resulttype = BITSET_CONTAINER_TYPE;
    // run_container_free(r);
    return answer;
}